

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

int enumDotSkin(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
               pointSet *dots,int srcFlag)

{
  int iVar1;
  atom *paVar2;
  bool local_5d;
  int local_5c;
  uint local_58;
  int dummy;
  int usesMovingAtoms;
  int dotTotal;
  atom *atomList2;
  atom *atomList;
  atom *src;
  pointSet *ppStack_30;
  int srcFlag_local;
  pointSet *dots_local;
  atomBins *bbins_local;
  atom *allMovingAtoms_local;
  atomBins *abins_local;
  atom *allMainAtoms_local;
  
  atomList2 = (atom *)0x0;
  _usesMovingAtoms = (atom *)0x0;
  dummy = 0;
  local_5c = 1;
  local_5d = allMovingAtoms != (atom *)0x0 && bbins != (atomBins *)0x0;
  local_58 = (uint)local_5d;
  src._4_4_ = srcFlag;
  ppStack_30 = dots;
  dots_local = (pointSet *)bbins;
  bbins_local = (atomBins *)allMovingAtoms;
  allMovingAtoms_local = (atom *)abins;
  abins_local = (atomBins *)allMainAtoms;
  for (atomList = allMainAtoms; atomList != (atom *)0x0; atomList = atomList->next) {
    if ((atomList->flags & src._4_4_) != 0) {
      atomList2 = findTouchingAtoms(atomList,(atom *)0x0,(atomBins *)allMovingAtoms_local,0.0,0,
                                    &local_5c);
      paVar2 = atomList2;
      if (local_58 != 0) {
        paVar2 = findTouchingAtoms(atomList,atomList2,(atomBins *)dots_local,0.0,0,&local_5c);
      }
      _usesMovingAtoms = paVar2;
      if ((_usesMovingAtoms != (atom *)0x0) &&
         (markBonds(atomList,_usesMovingAtoms,1,Maxbonded), 3 < Maxbonded)) {
        fixupLongBondChains(atomList,_usesMovingAtoms,3);
      }
      iVar1 = countSkin(atomList,_usesMovingAtoms,ppStack_30);
      dummy = iVar1 + dummy;
      if ((Verbose != 0) && (ShowTicks != 0)) {
        fprintf(_stderr,"%s%s   \r",atomList->r->resname);
      }
    }
  }
  if (local_58 != 0) {
    for (atomList = (atom *)bbins_local; atomList != (atom *)0x0; atomList = atomList->next) {
      if ((atomList->flags & src._4_4_) != 0) {
        atomList2 = findTouchingAtoms(atomList,(atom *)0x0,(atomBins *)allMovingAtoms_local,0.0,0,
                                      &local_5c);
        _usesMovingAtoms =
             findTouchingAtoms(atomList,atomList2,(atomBins *)dots_local,0.0,0,&local_5c);
        if ((_usesMovingAtoms != (atom *)0x0) &&
           (markBonds(atomList,_usesMovingAtoms,1,Maxbonded), 3 < Maxbonded)) {
          fixupLongBondChains(atomList,_usesMovingAtoms,3);
        }
        iVar1 = countSkin(atomList,_usesMovingAtoms,ppStack_30);
        dummy = iVar1 + dummy;
        if ((Verbose != 0) && (ShowTicks != 0)) {
          fprintf(_stderr,"%s%s   \r",atomList->r->resname);
        }
      }
    }
  }
  return dummy;
}

Assistant:

int enumDotSkin(atom *allMainAtoms, atomBins *abins,
	    atom *allMovingAtoms, atomBins *bbins,
	    pointSet dots[], int srcFlag)
{
   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int dotTotal = 0, usesMovingAtoms = FALSE;
   int dummy = TRUE;

         /*numSkinDots used to normalize output score*/

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) {
      if (src->flags & srcFlag) {

	 atomList  = findTouchingAtoms(src, NULL,     abins, 0.0, 0, &dummy);
	 if (usesMovingAtoms) {
	    atomList2 = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
	 }
	 else { atomList2 = atomList; }

	 if (atomList2) {
	    markBonds(src, atomList2, 1, Maxbonded); /*in enumDotSkin()*/
	    if (Maxbonded > 3) { fixupLongBondChains(src, atomList2, 3); }
	 }
	 dotTotal += countSkin(src, atomList2, dots);

	 if(Verbose && ShowTicks) {
	    fprintf(stderr, "%s%s   \r",
	               src->r->resname, src->r->Hy36resno);
	 }
      }
   }

   if (usesMovingAtoms) {
      for(src = allMovingAtoms; src; src = src->next) {
	 if (src->flags & srcFlag) {

	    atomList  = findTouchingAtoms(src, NULL,     abins, 0.0, 0, &dummy);
	    atomList2 = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
	    if (atomList2) {
	       markBonds(src, atomList2, 1, Maxbonded); /*in enumDotSkin()*/
	       if (Maxbonded > 3) { fixupLongBondChains(src, atomList2, 3); }
	    }
	    dotTotal += countSkin(src, atomList2, dots);

	    if(Verbose && ShowTicks) {
	       fprintf(stderr, "%s%s   \r",
	               src->r->resname, src->r->Hy36resno);
	    }
	 }
      }
   }
   return dotTotal;
}